

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O0

void __thiscall TPZEigenAnalysis::AssembleT<std::complex<double>>(TPZEigenAnalysis *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  TPZStructMatrix *pTVar4;
  void *pvVar5;
  long lVar6;
  TPZBaseMatrix *pTVar7;
  int64_t iVar8;
  TPZMatrix<std::complex<double>_> *pTVar9;
  long *in_RDI;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> mat_3;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> matB;
  TPZMatGeneralisedEigenVal *eigmat_1;
  TPZMaterial *mat_2;
  pair<const_int,_TPZMaterial_*> *item_1;
  iterator __end2_1;
  iterator __begin2_1;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *__range2_1;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *materialVec_1;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> mat_1;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> matA;
  TPZMatGeneralisedEigenVal *eigmat;
  TPZMaterial *mat;
  pair<const_int,_TPZMaterial_*> *item;
  iterator __end2;
  iterator __begin2;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *__range2;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *materialVec;
  TPZEigenSolver<std::complex<double>_> *eigSolver;
  int64_t sz;
  TPZKrylovEigenSolver<std::complex<double>_> defaultSolver;
  int dimKrylov;
  int nev;
  TPZEigenSolver<std::complex<double>_> *eigSolver_1;
  TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  defaultMatrix;
  stringstream sout;
  TPZFMatrix<std::complex<double>_> dummyRhs;
  anon_class_1_0_00000001 PardisoConfig;
  TPZEigenSolver<std::complex<double>_> *in_stack_fffffffffffff8d8;
  TPZKrylovEigenSolver<std::complex<double>_> *in_stack_fffffffffffff8e0;
  TPZEigenAnalysis *in_stack_fffffffffffff8f0;
  long *plVar10;
  TPZCompMesh *in_stack_fffffffffffff8f8;
  TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
  *in_stack_fffffffffffff900;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffff910;
  undefined7 in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff91f;
  TPZAnalysis *in_stack_fffffffffffff920;
  long *local_6c8;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffff978;
  anon_class_1_0_00000001 *in_stack_fffffffffffff980;
  long *local_650;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_5b8;
  long *local_5b0;
  TPZMaterial *local_5a8;
  reference local_5a0;
  _Self local_598;
  _Self local_590;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *local_588;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *local_580;
  undefined1 local_568 [16];
  undefined1 local_558 [8];
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_550;
  long *local_548;
  TPZMaterial *local_540;
  reference local_538;
  _Self local_530;
  _Self local_528;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *local_520;
  map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
  *local_518;
  TPZEigenSolver<std::complex<double>_> *local_510;
  int64_t local_508;
  undefined1 local_500 [408];
  undefined4 local_368;
  undefined4 local_364;
  TPZEigenSolver<std::complex<double>_> *local_360;
  size_t in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  string local_258 [48];
  stringstream local_228 [16];
  ostream local_218 [376];
  undefined1 local_a0 [160];
  
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(in_stack_fffffffffffff910);
  if (in_RDI[2] == 0) {
    std::__cxx11::stringstream::stringstream(local_228);
    std::operator<<(local_218,"void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]");
    std::operator<<(local_218,"\nNo computational mesh found!\n");
    std::__cxx11::stringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::stringstream::~stringstream(local_228);
    goto LAB_01c44ce4;
  }
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x54));
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "Setting default struct matrix: skyline(non-symmetric)");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
    TPZSkylineNSymStructMatrix(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
    TPZAnalysis::SetStructuralMatrix
              (in_stack_fffffffffffff920,
               (TPZStructMatrix *)CONCAT17(in_stack_fffffffffffff91f,in_stack_fffffffffffff918));
    TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::
    ~TPZSkylineNSymStructMatrix
              ((TPZSkylineNSymStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
                *)in_stack_fffffffffffff8e0);
  }
  pTVar4 = TPZAutoPointer<TPZStructMatrix>::operator->
                     ((TPZAutoPointer<TPZStructMatrix> *)(in_RDI + 0x54));
  TPZStrMatParInterface::SetComputeRhs
            ((TPZStrMatParInterface *)(&pTVar4->field_0x0 + *(long *)(*(long *)pTVar4 + -0x60)),
             false);
  local_360 = EigenSolver<std::complex<double>>(in_stack_fffffffffffff8f0);
  if (local_360 == (TPZEigenSolver<std::complex<double>_> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Setting default solver: Krylov");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_364 = 10;
    local_368 = 100;
    TPZKrylovEigenSolver<std::complex<double>_>::TPZKrylovEigenSolver
              ((TPZKrylovEigenSolver<std::complex<double>_> *)in_stack_fffffffffffff8f0);
    TPZKrylovEigenSolver<std::complex<double>_>::SetNEigenpairs
              (in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    TPZKrylovEigenSolver<std::complex<double>_>::SetKrylovDim
              (in_stack_fffffffffffff8e0,(int)((ulong)in_stack_fffffffffffff8d8 >> 0x20));
    poVar3 = std::operator<<((ostream *)&std::cout,"Setting nev: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,10);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&std::cout,"Setting krylov dim: ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,100);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    (**(code **)(*in_RDI + 0x80))(in_RDI,local_500);
    TPZKrylovEigenSolver<std::complex<double>_>::~TPZKrylovEigenSolver
              ((TPZKrylovEigenSolver<std::complex<double>_> *)0x1c441d6);
  }
  pTVar4 = TPZAutoPointer<TPZStructMatrix>::operator->
                     ((TPZAutoPointer<TPZStructMatrix> *)(in_RDI + 0x54));
  ::TPZStructMatrix::EquationFilter(pTVar4);
  local_508 = TPZEquationFilter::NActiveEquations((TPZEquationFilter *)in_stack_fffffffffffff8d8);
  local_510 = EigenSolver<std::complex<double>>(in_stack_fffffffffffff8f0);
  bVar1 = TPZEigenSolver<std::complex<double>_>::IsGeneralised(local_510);
  if (bVar1) {
    local_520 = TPZCompMesh::MaterialVec((TPZCompMesh *)in_RDI[2]);
    local_518 = local_520;
    local_528._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::begin((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                  *)in_stack_fffffffffffff8d8);
    local_530._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::end((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                *)in_stack_fffffffffffff8d8);
    while (bVar1 = std::operator!=(&local_528,&local_530), bVar1) {
      local_538 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator*
                            ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                             in_stack_fffffffffffff8e0);
      local_540 = local_538->second;
      if (local_540 == (TPZMaterial *)0x0) {
        local_650 = (long *)0x0;
      }
      else {
        local_650 = (long *)__dynamic_cast(local_540,&TPZMaterial::typeinfo,
                                           &TPZMatGeneralisedEigenVal::typeinfo,0xfffffffffffffffe);
      }
      local_548 = local_650;
      if (local_650 == (long *)0x0) {
        std::operator<<((ostream *)&std::cerr,
                        "void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]");
        poVar3 = std::operator<<((ostream *)&std::cerr,"\nERROR: cannot solve generalised EVP if\n")
        ;
        poVar3 = std::operator<<(poVar3,"the materials do not have the interface:\n");
        poVar3 = std::operator<<(poVar3,"TPZMatGeneralisedEigenVal\n");
        std::operator<<(poVar3,"Aborting...\n");
        pzinternal::DebugStopImpl(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      }
      else {
        (**(code **)(*local_650 + 0x48))();
      }
      std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                 in_stack_fffffffffffff8e0);
    }
  }
  TPZEigenSolver<std::complex<double>_>::MatrixA(in_stack_fffffffffffff8d8);
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&local_550);
  if (bVar1) {
    pTVar7 = &TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->(&local_550)->
              super_TPZBaseMatrix;
    iVar8 = TPZBaseMatrix::Rows(pTVar7);
    if (iVar8 != local_508) goto LAB_01c445c3;
    in_stack_fffffffffffff980 =
         (anon_class_1_0_00000001 *)
         TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->(&local_550);
    (**(code **)(*(long *)in_stack_fffffffffffff980 + 0x78))();
    pTVar4 = TPZAutoPointer<TPZStructMatrix>::operator->
                       ((TPZAutoPointer<TPZStructMatrix> *)(in_RDI + 0x54));
    lVar6 = *(long *)(*(long *)pTVar4 + -0x60);
    in_stack_fffffffffffff978 =
         TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator*(&local_550);
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0,
               (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8d8);
    (**(code **)(*(long *)(&pTVar4->field_0x0 + lVar6) + 0x48))
              (&pTVar4->field_0x0 + lVar6,in_stack_fffffffffffff978,local_a0,local_558);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0);
  }
  else {
LAB_01c445c3:
    pTVar4 = TPZAutoPointer<TPZStructMatrix>::operator->
                       ((TPZAutoPointer<TPZStructMatrix> *)(in_RDI + 0x54));
    lVar6 = *(long *)(*(long *)pTVar4 + -0x60);
    TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0,
               (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8d8);
    lVar6 = (**(code **)(*(long *)(&pTVar4->field_0x0 + lVar6) + 0x68))
                      (&pTVar4->field_0x0 + lVar6,local_a0,local_568);
    if (lVar6 != 0) {
      __dynamic_cast(lVar6,&TPZBaseMatrix::typeinfo,&TPZMatrix<std::complex<double>>::typeinfo,0);
    }
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff900,
               (TPZMatrix<std::complex<double>_> *)in_stack_fffffffffffff8f8);
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
              ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0);
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0,
               (TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8d8);
    TPZEigenSolver<std::complex<double>_>::SetMatrixA
              (&in_stack_fffffffffffff8e0->super_TPZEigenSolver<std::complex<double>_>,
               (TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8d8);
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
  }
  TPZEigenSolver<std::complex<double>_>::MatrixA(in_stack_fffffffffffff8d8);
  AssembleT<std::complex<double>_>::anon_class_1_0_00000001::operator()
            (in_stack_fffffffffffff980,
             (TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff978);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
  bVar1 = TPZEigenSolver<std::complex<double>_>::IsGeneralised(local_510);
  if (bVar1) {
    local_588 = TPZCompMesh::MaterialVec((TPZCompMesh *)in_RDI[2]);
    local_580 = local_588;
    local_590._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::begin((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                  *)in_stack_fffffffffffff8d8);
    local_598._M_node =
         (_Base_ptr)
         std::
         map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
         ::end((map<int,_TPZMaterial_*,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterial_*>_>_>
                *)in_stack_fffffffffffff8d8);
    while (bVar1 = std::operator!=(&local_590,&local_598), bVar1) {
      local_5a0 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator*
                            ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                             in_stack_fffffffffffff8e0);
      local_5a8 = local_5a0->second;
      if (local_5a8 == (TPZMaterial *)0x0) {
        local_6c8 = (long *)0x0;
      }
      else {
        local_6c8 = (long *)__dynamic_cast(local_5a8,&TPZMaterial::typeinfo,
                                           &TPZMatGeneralisedEigenVal::typeinfo,0xfffffffffffffffe);
      }
      local_5b0 = local_6c8;
      if (local_6c8 == (long *)0x0) {
        std::operator<<((ostream *)&std::cerr,
                        "void TPZEigenAnalysis::AssembleT() [TVar = std::complex<double>]");
        poVar3 = std::operator<<((ostream *)&std::cerr,"\nERROR: cannot solve generalised EVP if\n")
        ;
        poVar3 = std::operator<<(poVar3,"the materials do not have the interface:\n");
        poVar3 = std::operator<<(poVar3,"TPZMatGeneralisedEigenVal\n");
        std::operator<<(poVar3,"Aborting...\n");
        pzinternal::DebugStopImpl(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      }
      else {
        (**(code **)(*local_6c8 + 0x50))();
      }
      std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterial_*>_> *)
                 in_stack_fffffffffffff8e0);
    }
    TPZEigenSolver<std::complex<double>_>::MatrixB(in_stack_fffffffffffff8d8);
    bVar1 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)&local_5b8);
    if (bVar1) {
      pTVar7 = &TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->(&local_5b8)->
                super_TPZBaseMatrix;
      iVar8 = TPZBaseMatrix::Rows(pTVar7);
      if (iVar8 != local_508) goto LAB_01c44ad6;
      pTVar9 = TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->(&local_5b8);
      (*(pTVar9->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xf])();
      pTVar4 = TPZAutoPointer<TPZStructMatrix>::operator->
                         ((TPZAutoPointer<TPZStructMatrix> *)(in_RDI + 0x54));
      plVar10 = (long *)(&pTVar4->field_0x0 + *(long *)(*(long *)pTVar4 + -0x60));
      pTVar9 = TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator*(&local_5b8);
      TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0,
                 (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8d8);
      (**(code **)(*plVar10 + 0x48))(plVar10,pTVar9,local_a0,local_5c0);
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0);
    }
    else {
LAB_01c44ad6:
      pTVar4 = TPZAutoPointer<TPZStructMatrix>::operator->
                         ((TPZAutoPointer<TPZStructMatrix> *)(in_RDI + 0x54));
      plVar10 = (long *)(&pTVar4->field_0x0 + *(long *)(*(long *)pTVar4 + -0x60));
      TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0,
                 (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8d8);
      lVar6 = (**(code **)(*plVar10 + 0x68))(plVar10,local_a0,local_5d0);
      if (lVar6 == 0) {
        in_stack_fffffffffffff8e0 = (TPZKrylovEigenSolver<std::complex<double>_> *)0x0;
      }
      else {
        in_stack_fffffffffffff8e0 =
             (TPZKrylovEigenSolver<std::complex<double>_> *)
             __dynamic_cast(lVar6,&TPZBaseMatrix::typeinfo,
                            &TPZMatrix<std::complex<double>>::typeinfo,0);
      }
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff900,
                 (TPZMatrix<std::complex<double>_> *)in_stack_fffffffffffff8f8);
      TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
                ((TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffff8e0);
      in_stack_fffffffffffff8d8 = local_510;
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::TPZAutoPointer
                ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0,
                 (TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)local_510);
      TPZEigenSolver<std::complex<double>_>::SetMatrixB
                (&in_stack_fffffffffffff8e0->super_TPZEigenSolver<std::complex<double>_>,
                 (TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8d8);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
      TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
                ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
    }
    TPZEigenSolver<std::complex<double>_>::MatrixB(in_stack_fffffffffffff8d8);
    AssembleT<std::complex<double>_>::anon_class_1_0_00000001::operator()
              (in_stack_fffffffffffff980,
               (TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff978);
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
    TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
              ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
  }
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffff8e0);
LAB_01c44ce4:
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x1c44cf1);
  return;
}

Assistant:

void TPZEigenAnalysis::AssembleT()
{
  //this lambda will be used to prevent pardiso for disturbing pivots
  auto PardisoConfig = [](TPZAutoPointer<TPZMatrix<TVar>> mat){
    auto ssp = TPZAutoPointerDynamicCast<TPZSYsmpMatrix<TVar>>(mat);
    auto sp = TPZAutoPointerDynamicCast<TPZFYsmpMatrix<TVar>>(mat);
    TPZPardisoSolver<TVar> *pardiso{nullptr};
    if(ssp){
      pardiso = &(ssp->GetPardisoControl());
    }else if(sp){
      pardiso = &(sp->GetPardisoControl());
    }
    if(pardiso){
      auto param = pardiso->GetParam();
      //do not perturb pivot elements
      param[0] = 0;
    }
  };
  
  //it wont be resized or anything.
  TPZFMatrix<TVar> dummyRhs;
  if (!fCompMesh) {
    std::stringstream sout;
    sout << __PRETTY_FUNCTION__;
    sout << "\nNo computational mesh found!\n";
#ifdef PZ_LOG
    LOGPZ_ERROR(logger, sout.str().c_str());
#else
    std::cout << sout.str().c_str() << std::endl;
#endif
    return;
  }
  if (!this->fStructMatrix) {
#ifdef USING_MKL
    std::cout << "Setting default struct matrix: sparse(non-symmetric)"
              << std::endl;
    TPZSpStructMatrix<TVar> defaultMatrix(fCompMesh);
#else
    std::cout << "Setting default struct matrix: skyline(non-symmetric)"
              << std::endl;
    TPZSkylineNSymStructMatrix<TVar> defaultMatrix(fCompMesh);
#endif
    this->SetStructuralMatrix(defaultMatrix);
  }
  
  fStructMatrix->SetComputeRhs(false);
  
  {
    auto *eigSolver = &(this->EigenSolver<TVar>()); 
    if (!eigSolver) {
      std::cout << "Setting default solver: Krylov" << std::endl;
      constexpr int nev{10};
      constexpr int dimKrylov{100};
      TPZKrylovEigenSolver<TVar> defaultSolver;
      defaultSolver.SetNEigenpairs(nev);
      defaultSolver.SetKrylovDim(dimKrylov);
      std::cout << "Setting nev: " << nev << std::endl;
      std::cout << "Setting krylov dim: " << dimKrylov << std::endl;
      this->SetSolver(defaultSolver);
    }
  }
  
  const auto sz = fStructMatrix->EquationFilter().NActiveEquations();
  auto &eigSolver = this->EigenSolver<TVar>();
  if (eigSolver.IsGeneralised()) {
    
    
    auto &materialVec = fCompMesh->MaterialVec();
    for (auto &&item : materialVec) {
      auto mat = (item.second);
      auto eigmat = dynamic_cast<TPZMatGeneralisedEigenVal *>(mat);
      if (eigmat)
        eigmat->SetMatrixA();
      else {
        PZError << __PRETTY_FUNCTION__;
        PZError << "\nERROR: cannot solve generalised EVP if\n"
                << "the materials do not have the interface:\n"
                << "TPZMatGeneralisedEigenVal\n"
                << "Aborting...\n";
        DebugStop();
      }
    }
  }
  auto matA = eigSolver.MatrixA();
  if (matA && matA->Rows() == sz) {
    matA->Zero();
    fStructMatrix->Assemble(*matA, dummyRhs, fGuiInterface);
  } else {
    TPZAutoPointer<TPZMatrix<TVar>> mat =
      dynamic_cast<TPZMatrix<TVar>*>(
          fStructMatrix->CreateAssemble(dummyRhs, fGuiInterface));
    eigSolver.SetMatrixA(mat);
  }
  PardisoConfig(eigSolver.MatrixA());
  // fSolver->UpdateFrom(fSolver->MatrixA());
  if (eigSolver.IsGeneralised()) {
    auto &materialVec = fCompMesh->MaterialVec();
    for (auto &&item : materialVec) {
      auto mat = (item.second);
      auto eigmat = dynamic_cast<TPZMatGeneralisedEigenVal *>(mat);
      if (eigmat)
        eigmat->SetMatrixB();
      else {
        PZError << __PRETTY_FUNCTION__;
        PZError << "\nERROR: cannot solve generalised EVP if\n"
                << "the materials do not have the interface:\n"
                << "TPZMatGeneralisedEigenVal\n"
                << "Aborting...\n";
        DebugStop();
      }
    }
    auto matB = eigSolver.MatrixB();
    if (matB && matB->Rows() == sz) {
      matB->Zero();
      fStructMatrix->Assemble(*matB, dummyRhs, fGuiInterface);
    } else {
      TPZAutoPointer<TPZMatrix<TVar>> mat =
        dynamic_cast<TPZMatrix<TVar>*>(
          fStructMatrix->CreateAssemble(dummyRhs, fGuiInterface));
      eigSolver.SetMatrixB(mat);
    }
    PardisoConfig(eigSolver.MatrixB());
  }
}